

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalSelectDeferred(Fts3Cursor *pCsr,Fts3Expr *pRoot,Fts3TokenAndCost *aTC,int nTC)

{
  int iVar1;
  char *pcStack_80;
  int nCount;
  char *pList;
  Fts3PhraseToken *pFStack_70;
  int nList;
  Fts3PhraseToken *pToken_1;
  Fts3PhraseToken *pToken;
  Fts3TokenAndCost *pTC;
  int iTC;
  int nLoad4;
  int nMinEst;
  int nToken;
  int nOvfl;
  int ii;
  int rc;
  int nDocSize;
  Fts3Table *pTab;
  Fts3TokenAndCost *pFStack_28;
  int nTC_local;
  Fts3TokenAndCost *aTC_local;
  Fts3Expr *pRoot_local;
  Fts3Cursor *pCsr_local;
  
  _rc = (Fts3Table *)(pCsr->base).pVtab;
  ii = 0;
  nOvfl = 0;
  nMinEst = 0;
  nLoad4 = 0;
  iTC = 0;
  pTC._4_4_ = 1;
  if (_rc->zContentTbl == (char *)0x0) {
    for (nToken = 0; nToken < nTC; nToken = nToken + 1) {
      if (aTC[nToken].pRoot == pRoot) {
        nMinEst = aTC[nToken].nOvfl + nMinEst;
        nLoad4 = nLoad4 + 1;
      }
    }
    if ((nMinEst == 0) || (nLoad4 < 2)) {
      pCsr_local._4_4_ = 0;
    }
    else {
      pTab._4_4_ = nTC;
      pFStack_28 = aTC;
      aTC_local = (Fts3TokenAndCost *)pRoot;
      pRoot_local = (Fts3Expr *)pCsr;
      nOvfl = fts3EvalAverageDocsize(pCsr,&ii);
      for (nToken = 0; nToken < nLoad4 && nOvfl == 0; nToken = nToken + 1) {
        pToken = (Fts3PhraseToken *)0x0;
        for (pTC._0_4_ = 0; (int)pTC < pTab._4_4_; pTC._0_4_ = (int)pTC + 1) {
          if (((pFStack_28[(int)pTC].pToken != (Fts3PhraseToken *)0x0) &&
              (pFStack_28[(int)pTC].pRoot == (Fts3Expr *)aTC_local)) &&
             ((pToken == (Fts3PhraseToken *)0x0 ||
              (pFStack_28[(int)pTC].nOvfl < *(int *)&pToken->pSegcsr)))) {
            pToken = (Fts3PhraseToken *)(pFStack_28 + (int)pTC);
          }
        }
        if ((nToken == 0) ||
           (*(int *)&pToken->pSegcsr < ((iTC + pTC._4_4_ / 4 + -1) / (pTC._4_4_ / 4)) * ii)) {
          if (nToken < 0xc) {
            pTC._4_4_ = pTC._4_4_ << 2;
          }
          if ((nToken == 0) || ((1 < *(int *)(pToken->z + 0x50) && (nToken != nLoad4 + -1)))) {
            pFStack_70 = *(Fts3PhraseToken **)&pToken->bFirst;
            pList._4_4_ = 0;
            pcStack_80 = (char *)0x0;
            nOvfl = fts3TermSelect(_rc,pFStack_70,*(int *)((long)&pToken->pSegcsr + 4),
                                   (int *)((long)&pList + 4),&stack0xffffffffffffff80);
            if (nOvfl == 0) {
              nOvfl = fts3EvalPhraseMergeToken
                                (_rc,(Fts3Phrase *)pToken->z,pToken->n,pcStack_80,pList._4_4_);
            }
            if ((nOvfl == 0) &&
               ((iVar1 = fts3DoclistCountDocids(*(char **)pToken->z,*(int *)(pToken->z + 8)),
                nToken == 0 || (iVar1 < iTC)))) {
              iTC = iVar1;
            }
          }
        }
        else {
          pToken_1 = *(Fts3PhraseToken **)&pToken->bFirst;
          nOvfl = sqlite3Fts3DeferToken
                            ((Fts3Cursor *)pRoot_local,pToken_1,*(int *)((long)&pToken->pSegcsr + 4)
                            );
          fts3SegReaderCursorFree(pToken_1->pSegcsr);
          pToken_1->pSegcsr = (Fts3MultiSegReader *)0x0;
        }
        *(undefined8 *)&pToken->bFirst = 0;
      }
      pCsr_local._4_4_ = nOvfl;
    }
  }
  else {
    pCsr_local._4_4_ = 0;
  }
  return pCsr_local._4_4_;
}

Assistant:

static int fts3EvalSelectDeferred(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pRoot,                /* Consider tokens with this root node */
  Fts3TokenAndCost *aTC,          /* Array of expression tokens and costs */
  int nTC                         /* Number of entries in aTC[] */
){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int nDocSize = 0;               /* Number of pages per doc loaded */
  int rc = SQLITE_OK;             /* Return code */
  int ii;                         /* Iterator variable for various purposes */
  int nOvfl = 0;                  /* Total overflow pages used by doclists */
  int nToken = 0;                 /* Total number of tokens in cluster */

  int nMinEst = 0;                /* The minimum count for any phrase so far. */
  int nLoad4 = 1;                 /* (Phrases that will be loaded)^4. */

  /* Tokens are never deferred for FTS tables created using the content=xxx
  ** option. The reason being that it is not guaranteed that the content
  ** table actually contains the same data as the index. To prevent this from
  ** causing any problems, the deferred token optimization is completely
  ** disabled for content=xxx tables. */
  if( pTab->zContentTbl ){
    return SQLITE_OK;
  }

  /* Count the tokens in this AND/NEAR cluster. If none of the doclists
  ** associated with the tokens spill onto overflow pages, or if there is
  ** only 1 token, exit early. No tokens to defer in this case. */
  for(ii=0; ii<nTC; ii++){
    if( aTC[ii].pRoot==pRoot ){
      nOvfl += aTC[ii].nOvfl;
      nToken++;
    }
  }
  if( nOvfl==0 || nToken<2 ) return SQLITE_OK;

  /* Obtain the average docsize (in pages). */
  rc = fts3EvalAverageDocsize(pCsr, &nDocSize);
  assert( rc!=SQLITE_OK || nDocSize>0 );


  /* Iterate through all tokens in this AND/NEAR cluster, in ascending order 
  ** of the number of overflow pages that will be loaded by the pager layer 
  ** to retrieve the entire doclist for the token from the full-text index.
  ** Load the doclists for tokens that are either:
  **
  **   a. The cheapest token in the entire query (i.e. the one visited by the
  **      first iteration of this loop), or
  **
  **   b. Part of a multi-token phrase.
  **
  ** After each token doclist is loaded, merge it with the others from the
  ** same phrase and count the number of documents that the merged doclist
  ** contains. Set variable "nMinEst" to the smallest number of documents in 
  ** any phrase doclist for which 1 or more token doclists have been loaded.
  ** Let nOther be the number of other phrases for which it is certain that
  ** one or more tokens will not be deferred.
  **
  ** Then, for each token, defer it if loading the doclist would result in
  ** loading N or more overflow pages into memory, where N is computed as:
  **
  **    (nMinEst + 4^nOther - 1) / (4^nOther)
  */
  for(ii=0; ii<nToken && rc==SQLITE_OK; ii++){
    int iTC;                      /* Used to iterate through aTC[] array. */
    Fts3TokenAndCost *pTC = 0;    /* Set to cheapest remaining token. */

    /* Set pTC to point to the cheapest remaining token. */
    for(iTC=0; iTC<nTC; iTC++){
      if( aTC[iTC].pToken && aTC[iTC].pRoot==pRoot 
       && (!pTC || aTC[iTC].nOvfl<pTC->nOvfl) 
      ){
        pTC = &aTC[iTC];
      }
    }
    assert( pTC );

    if( ii && pTC->nOvfl>=((nMinEst+(nLoad4/4)-1)/(nLoad4/4))*nDocSize ){
      /* The number of overflow pages to load for this (and therefore all
      ** subsequent) tokens is greater than the estimated number of pages 
      ** that will be loaded if all subsequent tokens are deferred.
      */
      Fts3PhraseToken *pToken = pTC->pToken;
      rc = sqlite3Fts3DeferToken(pCsr, pToken, pTC->iCol);
      fts3SegReaderCursorFree(pToken->pSegcsr);
      pToken->pSegcsr = 0;
    }else{
      /* Set nLoad4 to the value of (4^nOther) for the next iteration of the
      ** for-loop. Except, limit the value to 2^24 to prevent it from 
      ** overflowing the 32-bit integer it is stored in. */
      if( ii<12 ) nLoad4 = nLoad4*4;

      if( ii==0 || (pTC->pPhrase->nToken>1 && ii!=nToken-1) ){
        /* Either this is the cheapest token in the entire query, or it is
        ** part of a multi-token phrase. Either way, the entire doclist will
        ** (eventually) be loaded into memory. It may as well be now. */
        Fts3PhraseToken *pToken = pTC->pToken;
        int nList = 0;
        char *pList = 0;
        rc = fts3TermSelect(pTab, pToken, pTC->iCol, &nList, &pList);
        assert( rc==SQLITE_OK || pList==0 );
        if( rc==SQLITE_OK ){
          rc = fts3EvalPhraseMergeToken(
              pTab, pTC->pPhrase, pTC->iToken,pList,nList
          );
        }
        if( rc==SQLITE_OK ){
          int nCount;
          nCount = fts3DoclistCountDocids(
              pTC->pPhrase->doclist.aAll, pTC->pPhrase->doclist.nAll
          );
          if( ii==0 || nCount<nMinEst ) nMinEst = nCount;
        }
      }
    }
    pTC->pToken = 0;
  }

  return rc;
}